

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

int __thiscall gl4cts::ShaderSubroutine::Utils::program::link(program *this,char *__from,char *__to)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  int extraout_EAX;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  TestError *this_02;
  GLint length;
  GLint status;
  vector<char,_std::allocator<char>_> message;
  int local_1cc;
  vector<char,_std::allocator<char>_> local_1c8;
  pointer local_1a8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  long lVar3;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_1cc = 0;
  if (this->m_compute_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(this->m_program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x20e);
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(this->m_program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x214);
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(this->m_program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x21a);
  }
  if (this->m_tesselation_control_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(this->m_program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x220);
  }
  if (this->m_tesselation_evaluation_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(this->m_program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x226);
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar3 + 0x10))(this->m_program_object_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"AttachShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x22c);
  }
  (**(code **)(lVar3 + 0xce8))(this->m_program_object_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x231);
  (**(code **)(lVar3 + 0x9d8))(this->m_program_object_id,0x8b82,&local_1cc);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x235);
  if (local_1cc == 1) {
    return extraout_EAX;
  }
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (**(code **)(lVar3 + 0x9d8))(this->m_program_object_id,0x8b84);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x23f);
  std::vector<char,_std::allocator<char>_>::resize(&local_1c8,0);
  (**(code **)(lVar3 + 0x988))
            (this->m_program_object_id,0,0,
             local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"GetProgramInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x245);
  local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Failed to link program:\n",0x18);
  local_1a8 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&local_1a8);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_128);
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to link program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x24b);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Utils::program::link() const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Link status */
	glw::GLint status = GL_FALSE;

	/* Attach shaders */
	if (0 != m_compute_shader_id)
	{
		gl.attachShader(m_program_object_id, m_compute_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != m_fragment_shader_id)
	{
		gl.attachShader(m_program_object_id, m_fragment_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != m_geometry_shader_id)
	{
		gl.attachShader(m_program_object_id, m_geometry_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != m_tesselation_control_shader_id)
	{
		gl.attachShader(m_program_object_id, m_tesselation_control_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != m_tesselation_evaluation_shader_id)
	{
		gl.attachShader(m_program_object_id, m_tesselation_evaluation_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	if (0 != m_vertex_shader_id)
	{
		gl.attachShader(m_program_object_id, m_vertex_shader_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "AttachShader");
	}

	/* Link */
	gl.linkProgram(m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(m_program_object_id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Get error log length */
		gl.getProgramiv(m_program_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length);

		/* Get error log */
		gl.getProgramInfoLog(m_program_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		/* Log */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Failed to link program:\n"
											<< &message[0] << tcu::TestLog::EndMessage;

		TCU_FAIL("Failed to link program");
	}
}